

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  pointer *pppOVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pcVar4;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  iterator iVar7;
  pointer psVar8;
  element_type *peVar9;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar10;
  pointer ppVar11;
  pointer pbVar12;
  bool bVar13;
  bool bVar14;
  type_conflict tVar15;
  Classifier CVar16;
  int iVar17;
  int iVar18;
  iterator __begin1;
  HorribleError *pHVar19;
  long *plVar20;
  pointer puVar21;
  undefined8 *puVar22;
  App *this_00;
  pointer psVar23;
  ArgumentMismatch *pAVar24;
  long *plVar25;
  undefined7 in_register_00000011;
  Option *pOVar26;
  uint uVar27;
  pointer pbVar28;
  long lVar29;
  undefined8 uVar30;
  pointer ppVar31;
  App *pAVar32;
  ulong uVar33;
  int t;
  string nvalue;
  App *sub;
  string dummy2;
  string arg_name;
  string rest;
  string current;
  string value;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_410;
  undefined1 local_3f8 [36];
  uint32_t local_3d4;
  undefined1 local_3d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  string local_3a0;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_380;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  undefined1 local_318 [18];
  undefined6 uStack_306;
  string local_2f8;
  string local_2d8;
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  _Any_data local_298;
  undefined1 local_288 [16];
  _Any_data local_278;
  undefined1 local_268 [16];
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  string local_1b8;
  _Any_data local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string local_138;
  anon_class_40_2_a297e68f_for__M_pred local_118;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar28 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  pcVar4 = pbVar28[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,pcVar4,pcVar4 + pbVar28[-1]._M_string_length);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  iVar17 = (int)CONCAT71(in_register_00000011,current_type);
  if (iVar17 == 2) {
    if ((((local_338._M_string_length < 2) || (*local_338._M_dataplus._M_p != '-')) ||
        (local_338._M_dataplus._M_p[1] == 0x2d)) || ((byte)local_338._M_dataplus._M_p[1] < 0x22)) {
      pHVar19 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar19,&local_b0);
      __cxa_throw(pHVar19,&HorribleError::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::substr((ulong)local_3f8,(ulong)&local_338);
    ::std::__cxx11::string::operator=((string *)&local_378,(string *)local_3f8);
    if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_);
    }
    ::std::__cxx11::string::substr((ulong)local_3f8,(ulong)&local_338);
    ::std::__cxx11::string::operator=((string *)&local_358,(string *)local_3f8);
    if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_);
    }
  }
  else if (iVar17 == 4) {
    bVar14 = detail::split_windows_style(&local_338,&local_378,&local_2f8);
    if (!bVar14) {
      pHVar19 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",""
                );
      HorribleError::HorribleError(pHVar19,&local_d0);
      __cxa_throw(pHVar19,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (iVar17 != 3) {
      pHVar19 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar19,&local_f0);
      __cxa_throw(pHVar19,&HorribleError::typeinfo,Error::~Error);
    }
    bVar14 = detail::split_long(&local_338,&local_378,&local_2f8);
    if (!bVar14) {
      pHVar19 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar19,&local_50);
      __cxa_throw(pHVar19,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var5._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var6._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar2 = &local_118.arg_name.field_2;
  local_118.arg_name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_378._M_dataplus._M_p,
             local_378._M_dataplus._M_p + local_378._M_string_length);
  local_118.current_type = current_type;
  local_410 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var5,_Var6,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.arg_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.arg_name._M_dataplus._M_p);
  }
  if (local_410 ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar8 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar23 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar23 != psVar8;
        psVar23 = psVar23 + 1) {
      pAVar32 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar32->name_)._M_string_length == 0) && (pAVar32->disabled_ == false)) &&
         (bVar14 = _parse_arg(pAVar32,args,current_type,param_3), bVar14)) {
        peVar9 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar14 = true;
        if (peVar9->pre_parse_called_ == false) {
          pbVar28 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          peVar9->pre_parse_called_ = true;
          if ((peVar9->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_3f8._0_8_ = (long)pbVar12 - (long)pbVar28 >> 5;
            (*(peVar9->pre_parse_callback_)._M_invoker)
                      ((_Any_data *)&peVar9->pre_parse_callback_,(unsigned_long *)local_3f8);
          }
        }
        goto LAB_00120f67;
      }
    }
    if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
       (2 < local_338._M_string_length)) {
      local_3f8._0_8_ = local_3f8 + 0x10;
      local_3f8._8_8_ = 0;
      local_3f8[0x10] = '\0';
      local_3d0._8_8_ = 0;
      local_3d0._16_8_ = local_3d0._16_8_ & 0xffffffffffffff00;
      uVar33 = (ulong)unique0x10002c4f >> 0x10;
      stack0xfffffffffffffcf8 = (pointer)CONCAT62((int6)uVar33,0x2d);
      local_318._8_8_ = (pointer)0x1;
      local_3d0._0_8_ = (Option *)(local_3d0 + 0x10);
      local_318._0_8_ = (pointer)(local_318 + 0x10);
      plVar20 = (long *)::std::__cxx11::string::_M_append
                                  (local_318,(ulong)local_338._M_dataplus._M_p);
      plVar25 = plVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar25) {
        local_3a0.field_2._M_allocated_capacity = *plVar25;
        local_3a0.field_2._8_8_ = plVar20[3];
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *plVar25;
        local_3a0._M_dataplus._M_p = (pointer)*plVar20;
      }
      local_3a0._M_string_length = plVar20[1];
      *plVar20 = (long)plVar25;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      detail::split_long(&local_3a0,(string *)local_3f8,(string *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_);
      }
      _Var5._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      _Var6._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1d8._M_allocated_capacity = (size_type)local_1c8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_3f8._0_8_,(pointer)(local_3f8._0_8_ + local_3f8._8_8_));
      local_410 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (_Var5,_Var6,(anon_class_32_1_6b09f7e2_for__M_pred *)&local_1d8);
      if ((undefined1 *)local_1d8._M_allocated_capacity != local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity);
      }
      puVar10 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_410 != puVar10) {
        ::std::__cxx11::string::_M_assign((string *)&local_378);
        ::std::__cxx11::string::_M_assign((string *)&local_2f8);
        local_358._M_string_length = 0;
        *local_358._M_dataplus._M_p = '\0';
      }
      if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_);
      }
      if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
        operator_delete((void *)local_3f8._0_8_);
      }
      if (local_410 != puVar10) goto LAB_0011fcf6;
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      uVar33 = ::std::__cxx11::string::find((char)&local_378,0x2e);
      if ((uVar33 != 0xffffffffffffffff) && (uVar33 < local_378._M_string_length - 1)) {
        ::std::__cxx11::string::substr((ulong)local_3f8,(ulong)&local_378);
        local_3b0._M_allocated_capacity =
             (size_type)_find_subcommand(this,(string *)local_3f8,true,false);
        if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
          operator_delete((void *)local_3f8._0_8_);
        }
        if ((App *)local_3b0._M_allocated_capacity != (App *)0x0) {
          pbVar28 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pcVar4 = pbVar28[-1]._M_dataplus._M_p;
          local_3f8._0_8_ = (Option *)(local_3f8 + 0x10);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3f8,pcVar4,pcVar4 + pbVar28[-1]._M_string_length);
          pbVar28 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
          pcVar4 = pbVar28[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar28[-1].field_2) {
            operator_delete(pcVar4);
          }
          ::std::__cxx11::string::substr((ulong)local_3d0,(ulong)&local_378);
          ::std::__cxx11::string::operator=((string *)&local_378,(string *)local_3d0);
          if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
            operator_delete((void *)local_3d0._0_8_);
          }
          if (local_378._M_string_length < 2) {
            ::std::__cxx11::string::substr((ulong)local_3d0,(ulong)local_3f8);
            *(char *)local_3d0._0_8_ = '-';
            if (2 < (ulong)local_3d0._8_8_) {
              ::std::__cxx11::string::substr((ulong)&local_3a0,(ulong)local_3d0);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                         &local_3a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p);
              }
              ::std::__cxx11::string::resize((ulong)local_3d0,'\x02');
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_3d0);
            if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
              operator_delete((void *)local_3d0._0_8_);
            }
            local_3d0._8_8_ = 0;
            local_3d0._16_8_ = local_3d0._16_8_ & 0xffffffffffffff00;
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            local_3a0._M_string_length = 0;
            local_3a0.field_2._M_allocated_capacity =
                 local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pbVar28 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            bVar3 = pbVar28[-1]._M_dataplus._M_p[1];
            current_type = SHORT;
            local_3d0._0_8_ = (Option *)(local_3d0 + 0x10);
            if (bVar3 == 0x2d || bVar3 < 0x22) goto LAB_00120cff;
LAB_00120d1a:
            bVar14 = _parse_arg((App *)local_3b0._M_allocated_capacity,args,current_type,true);
            if (!bVar14) goto LAB_00120e68;
            if (*(bool *)(local_3b0._M_allocated_capacity + 0x2e2) == false) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        (&this->parsed_subcommands_,(value_type *)&local_3b0._M_allocated_capacity);
            }
            increment_parsed(this);
            if (this->pre_parse_called_ == false) {
              pbVar28 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pbVar12 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              this->pre_parse_called_ = true;
              if ((this->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0)
              {
                local_318._0_8_ = (long)pbVar28 - (long)pbVar12 >> 5;
                (*(this->pre_parse_callback_)._M_invoker)
                          ((_Any_data *)&this->pre_parse_callback_,(unsigned_long *)local_318);
              }
            }
            else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0)) {
              local_3d4 = this->parsed_;
              ppVar31 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_3b0._8_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppVar11 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar31;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar11;
              clear(this);
              this->parsed_ = local_3d4;
              this->pre_parse_called_ = true;
              unique0x00012000 =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar11;
              local_318._0_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_318._8_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar31;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_318);
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_2b8);
            }
            if (*(_Manager_type *)(local_3b0._M_allocated_capacity + 0x80) == (_Manager_type)0x0) {
              bVar13 = false;
            }
            else {
              _process_env((App *)local_3b0._M_allocated_capacity);
              _process_callbacks((App *)local_3b0._M_allocated_capacity);
              _process_help_flags((App *)local_3b0._M_allocated_capacity,false,false);
              _process_requirements((App *)local_3b0._M_allocated_capacity);
              bVar13 = false;
              run_callback((App *)local_3b0._M_allocated_capacity,false,true);
            }
          }
          else {
            paVar2 = &local_3a0.field_2;
            local_3a0._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"--","");
            ::std::__cxx11::string::substr((ulong)local_318,(ulong)local_3f8);
            uVar30 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar2) {
              uVar30 = local_3a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 <
                (pointer)((Classifier *)local_318._8_8_ + local_3a0._M_string_length)) {
              ppVar31 = (pointer)0xf;
              if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
                ppVar31 = stack0xfffffffffffffcf8;
              }
              if (ppVar31 < (pointer)((Classifier *)local_318._8_8_ + local_3a0._M_string_length))
              goto LAB_00120c28;
              puVar22 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)local_318,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p)
              ;
            }
            else {
LAB_00120c28:
              puVar22 = (undefined8 *)
                        ::std::__cxx11::string::_M_append((char *)&local_3a0,local_318._0_8_);
            }
            local_3d0._0_8_ = local_3d0 + 0x10;
            pOVar26 = (Option *)(puVar22 + 2);
            if ((Option *)*puVar22 == pOVar26) {
              local_3d0._16_8_ = (pOVar26->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3d0._24_8_ = puVar22[3];
            }
            else {
              local_3d0._16_8_ = (pOVar26->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3d0._0_8_ = (Option *)*puVar22;
            }
            local_3d0._8_8_ = puVar22[1];
            *puVar22 = pOVar26;
            puVar22[1] = 0;
            *(undefined1 *)&(pOVar26->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3d0);
            if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
              operator_delete((void *)local_3d0._0_8_);
            }
            if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
              operator_delete((void *)local_318._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a0._M_dataplus._M_p);
            }
            local_3d0._16_8_ = local_3d0._16_8_ & 0xffffffffffffff00;
            local_3a0.field_2._M_allocated_capacity =
                 local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pbVar28 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            current_type = LONG;
LAB_00120cff:
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            local_3d0._0_8_ = local_3d0 + 0x10;
            local_3a0._M_string_length = 0;
            local_3d0._8_8_ = 0;
            bVar14 = detail::split_long(pbVar28 + -1,(string *)local_3d0,&local_3a0);
            if (bVar14) goto LAB_00120d1a;
LAB_00120e68:
            pbVar28 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
            pcVar4 = pbVar28[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar4 != &pbVar28[-1].field_2) {
              operator_delete(pcVar4);
            }
            bVar13 = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_3f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
            operator_delete((void *)local_3d0._0_8_);
          }
          if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
            operator_delete((void *)local_3f8._0_8_);
          }
          bVar14 = true;
          if (!bVar13) goto LAB_00120f67;
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (pAVar32 = this->parent_, this->fallthrough_ != true))
        {
          pbVar28 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
          pcVar4 = pbVar28[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar28[-1].field_2) {
            operator_delete(pcVar4);
          }
          local_3f8[0] = current_type;
          pAVar32 = this;
          if (this->allow_extras_ == false) {
            psVar23 = (this->subcommands_).
                      super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while ((pAVar32 = this,
                   psVar23 !=
                   (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish &&
                   ((pAVar32 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr, (pAVar32->name_)._M_string_length != 0 ||
                    (pAVar32->allow_extras_ == false))))) {
              psVar23 = psVar23 + 1;
            }
          }
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&pAVar32->missing_,local_3f8,&local_338);
          bVar14 = true;
        }
        else {
          do {
            this_00 = pAVar32;
            if (this_00->parent_ == (App *)0x0) break;
            pAVar32 = this_00->parent_;
          } while ((this_00->name_)._M_string_length == 0);
          bVar14 = _parse_arg(this_00,args,current_type,false);
        }
        goto LAB_00120f67;
      }
    }
    bVar14 = false;
    goto LAB_00120f67;
  }
LAB_0011fcf6:
  pbVar28 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
  pcVar4 = pbVar28[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &pbVar28[-1].field_2) {
    operator_delete(pcVar4);
  }
  pOVar26 = (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar26->inject_separator_ == true) &&
      (pbVar28 = (pOVar26->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      (pOVar26->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar28)) && (pbVar28[-1]._M_string_length != 0))
  {
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    Option::_add_result(pOVar26,&local_138,&pOVar26->results_);
    pOVar26->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
  }
  pOVar26 = (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((pOVar26->trigger_on_result_ == true) && (pOVar26->current_option_state_ == callback_run)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pOVar26->results_);
    pOVar26->current_option_state_ = parsing;
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  iVar17 = pOVar26->type_size_min_;
  local_3b0._8_4_ = pOVar26->expected_min_ * iVar17;
  if (iVar17 <= (int)local_3b0._8_4_) {
    local_3b0._8_4_ = iVar17;
  }
  local_3f8._0_4_ = pOVar26->type_size_max_;
  tVar15 = detail::checked_multiply<int>((int *)local_3f8,pOVar26->expected_max_);
  local_3d4 = 0x20000000;
  if (tVar15) {
    local_3d4 = local_3f8._0_4_;
  }
  if ((int)local_3d4 < 0x2000000) {
LAB_0011fe3c:
    local_3d4 = local_3f8._0_4_;
    if (local_3d4 != 0) goto LAB_0011fe46;
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_2f8._M_dataplus._M_p,
               local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
    Option::get_flag_value((string *)local_3f8,pOVar26,&local_378,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_3f8._0_8_,(pointer)(local_3f8._0_8_ + local_3f8._8_8_));
    Option::_add_result(pOVar26,&local_218,&pOVar26->results_);
    pOVar26->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    local_3d0._0_8_ =
         (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar7._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar7,
                 (Option **)local_3d0);
    }
    else {
      *iVar7._M_current = (Option *)local_3d0._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_);
    }
    local_3d4 = 0;
LAB_001201d0:
    iVar17 = 0;
  }
  else {
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar26->allow_extra_args_ == false) {
      local_3f8._0_4_ = pOVar26->type_size_max_;
      tVar15 = detail::checked_multiply<int>((int *)local_3f8,pOVar26->expected_min_);
      local_3d4 = 0x20000000;
      if (tVar15) {
        goto LAB_0011fe3c;
      }
    }
LAB_0011fe46:
    if (local_2f8._M_string_length == 0) {
      if ((char *)local_358._M_string_length == (char *)0x0) goto LAB_001201d0;
      pOVar26 = (local_410->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_358._M_dataplus._M_p,
                 local_358._M_dataplus._M_p + local_358._M_string_length);
      iVar17 = Option::_add_result(pOVar26,&local_258,&pOVar26->results_);
      pOVar26->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      local_3f8._0_8_ =
           (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar7._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar7,
                   (Option **)local_3f8);
      }
      else {
        *iVar7._M_current = (Option *)local_3f8._0_8_;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_358,0,(char *)local_358._M_string_length,0x12ff18);
    }
    else {
      pOVar26 = (local_410->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2f8._M_dataplus._M_p,
                 local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
      iVar17 = Option::_add_result(pOVar26,&local_238,&pOVar26->results_);
      pOVar26->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_3f8._0_8_ =
           (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar7._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar7,
                   (Option **)local_3f8);
      }
      else {
        *iVar7._M_current = (Option *)local_3f8._0_8_;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
    }
  }
  if (iVar17 < (int)local_3b0._8_4_) {
    local_380 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      pbVar28 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar28) {
        pAVar24 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_158,
                   (local_410->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        Option::get_type_name_abi_cxx11_
                  (&local_70,
                   (local_410->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ArgumentMismatch::TypedAtLeast(pAVar24,&local_158,local_3b0._8_4_,&local_70);
        __cxa_throw(pAVar24,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      pcVar4 = pbVar28[-1]._M_dataplus._M_p;
      local_3f8._0_8_ = (Option *)(local_3f8 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3f8,pcVar4,pcVar4 + pbVar28[-1]._M_string_length);
      pbVar28 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
      pcVar4 = pbVar28[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar28[-1].field_2) {
        operator_delete(pcVar4);
      }
      pOVar26 = (local_410->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_278._M_unused._M_object = local_268;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_3f8._0_8_,(pointer)(local_3f8._0_8_ + local_3f8._8_8_));
      iVar18 = Option::_add_result(pOVar26,(string *)&local_278,&pOVar26->results_);
      pOVar26->current_option_state_ = parsing;
      if ((undefined1 *)local_278._M_unused._0_8_ != local_268) {
        operator_delete(local_278._M_unused._M_object);
      }
      local_3d0._0_8_ =
           (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar7._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_380,iVar7,(Option **)local_3d0);
      }
      else {
        *iVar7._M_current = (Option *)local_3d0._0_8_;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
        operator_delete((void *)local_3f8._0_8_);
      }
      iVar17 = iVar17 + iVar18;
    } while (iVar17 < (int)local_3b0._8_4_);
  }
  if ((iVar17 < (int)local_3d4) ||
     (((local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    uVar33 = 0;
    for (puVar21 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar21 !=
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar21 = puVar21 + 1) {
      pOVar26 = (puVar21->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((pOVar26->pname_)._M_string_length != 0) &&
           ((pOVar26->super_OptionBase<CLI::Option>).required_ == true)) &&
          (uVar27 = pOVar26->expected_min_ * pOVar26->type_size_min_, 0 < (int)uVar27)) &&
         (lVar29 = (long)(pOVar26->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&(pOVar26->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl >> 5, (int)lVar29 < (int)uVar27)) {
        uVar33 = (uVar33 + uVar27) - lVar29;
      }
    }
    local_380 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      if (iVar17 < (int)local_3d4) {
        pbVar28 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pbVar28 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (((local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != true)
        goto LAB_001205a7;
      }
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar28) goto LAB_001205a7;
      CVar16 = _recognize(this,pbVar28 + -1,false);
      pbVar28 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((CVar16 != NONE) ||
         ((ulong)((long)pbVar28 -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar33))
      goto LAB_001205a7;
      if (this->validate_optional_arguments_ == true) {
        local_3f8._0_8_ = local_3f8 + 0x10;
        pcVar4 = pbVar28[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f8,pcVar4,pcVar4 + pbVar28[-1]._M_string_length);
        Option::_validate((string *)local_3d0,
                          (local_410->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                          (string *)local_3f8,0);
        ::std::__cxx11::string::operator=((string *)local_3f8,(string *)local_3d0);
        if ((Option *)local_3d0._0_8_ != (Option *)(local_3d0 + 0x10)) {
          operator_delete((void *)local_3d0._0_8_);
        }
        uVar30 = local_3f8._8_8_;
        if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
          operator_delete((void *)local_3f8._0_8_);
        }
        pbVar28 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (uVar30 != 0) goto LAB_001205a7;
      }
      pOVar26 = (local_410->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      pcVar4 = pbVar28[-1]._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,pcVar4,pcVar4 + pbVar28[-1]._M_string_length);
      iVar18 = Option::_add_result(pOVar26,&local_2d8,&pOVar26->results_);
      pOVar26->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      local_3f8._0_8_ =
           (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar7._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_380,iVar7,(Option **)local_3f8);
      }
      else {
        *iVar7._M_current = (Option *)local_3f8._0_8_;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      pbVar28 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
      pcVar4 = pbVar28[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar28[-1].field_2) {
        operator_delete(pcVar4);
      }
      iVar17 = iVar17 + iVar18;
    } while( true );
  }
LAB_001206fd:
  if (0 < (int)local_3b0._8_4_) {
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (iVar17 % pOVar26->type_size_max_ != 0) {
      if (pOVar26->type_size_max_ == pOVar26->type_size_min_) {
        pAVar24 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_1b8,
                   (local_410->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        pOVar26 = (local_410->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar17 = pOVar26->type_size_min_;
        Option::get_type_name_abi_cxx11_(&local_90,pOVar26);
        ArgumentMismatch::PartialType(pAVar24,&local_1b8,iVar17,&local_90);
        __cxa_throw(pAVar24,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      local_198._8_8_ = 0;
      local_188._M_local_buf[0] = '\0';
      local_198._M_unused._M_object = &local_188;
      Option::_add_result(pOVar26,(string *)&local_198,&pOVar26->results_);
      pOVar26->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_unused._0_8_ != &local_188) {
        operator_delete(local_198._M_unused._M_object);
      }
    }
  }
  pOVar26 = (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (pOVar26->trigger_on_result_ == true) {
    Option::run_callback(pOVar26);
  }
  bVar14 = true;
  if ((char *)local_358._M_string_length != (char *)0x0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                     "-",&local_358);
    ::std::__cxx11::string::operator=((string *)&local_358,(string *)local_3f8);
    if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&local_358);
  }
LAB_00120f67:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  return bVar14;
LAB_001205a7:
  if (((args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != pbVar28) &&
     (CVar16 = _recognize(this,pbVar28 + -1,true), CVar16 == POSITIONAL_MARK)) {
    pbVar28 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
    pcVar4 = pbVar28[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar28[-1].field_2) {
      operator_delete(pcVar4);
    }
  }
  if ((0 < (int)local_3d4) && (iVar17 == 0 && local_3b0._8_4_ == 0)) {
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_178._M_allocated_capacity = (size_type)&local_168;
    Option::get_flag_value
              ((string *)local_3f8,
               (local_410->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_378,
               (string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_allocated_capacity != &local_168) {
      operator_delete((void *)local_178._M_allocated_capacity);
    }
    pOVar26 = (local_410->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_298._M_unused._M_object = local_288;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_3f8._0_8_,(pointer)(local_3f8._0_8_ + local_3f8._8_8_));
    Option::_add_result(pOVar26,(string *)&local_298,&pOVar26->results_);
    pOVar26->current_option_state_ = parsing;
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_);
    }
    local_3d0._0_8_ =
         (local_410->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar7._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                (local_380,iVar7,(Option **)local_3d0);
    }
    else {
      *iVar7._M_current = (Option *)local_3d0._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    if ((Option *)local_3f8._0_8_ != (Option *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_);
    }
  }
  goto LAB_001206fd;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}